

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)6>>
          (WastParser *this,Location loc,Token token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Location loc_00;
  Opcode opcode;
  Result RVar2;
  LoadStoreExpr<(wabt::ExprType)6> *this_00;
  Enum EVar3;
  Address align;
  Address offset;
  Var memidx;
  Var local_78;
  
  opcode = Token::opcode(&token);
  Var::Var(&memidx);
  loc_00.filename._M_str = loc.filename._M_str;
  loc_00.filename._M_len = loc.filename._M_len;
  loc_00.field_1.field_1.offset = loc.field_1.field_1.offset;
  loc_00.field_1._8_8_ = loc.field_1._8_8_;
  RVar2 = ParseMemidx(this,loc_00,&memidx);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    ParseOffsetOpt(this,&offset);
    ParseAlignOpt(this,&align);
    this_00 = (LoadStoreExpr<(wabt::ExprType)6> *)operator_new(0xa0);
    Var::Var(&local_78,&memidx);
    LoadStoreExpr<(wabt::ExprType)6>::LoadStoreExpr(this_00,opcode,&local_78,align,offset,&loc);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
    }
    Var::~Var(&local_78);
    EVar3 = Ok;
  }
  Var::~Var(&memidx);
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseLoadStoreInstr(Location loc,
                                       Token token,
                                       std::unique_ptr<Expr>* out_expr) {
  Opcode opcode = token.opcode();
  Var memidx;
  Address offset;
  Address align;
  CHECK_RESULT(ParseMemidx(loc, &memidx));
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);
  out_expr->reset(new T(opcode, memidx, align, offset, loc));
  return Result::Ok;
}